

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeExpression(ExpressionContext *ctx,SynBase *syntax)

{
  uint uVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeBase *pTVar6;
  ExprError *pEVar7;
  char *pcVar8;
  ExprBase *pEVar5;
  
  uVar3 = ctx->expressionDepth;
  uVar1 = uVar3 + 1;
  ctx->expressionDepth = uVar1;
  if (0x800 < uVar1) {
    anon_unknown.dwarf_1117a3::Stop
              (ctx,syntax,"ERROR: reached maximum generic expression depth (%d)",0x800);
  }
  switch(syntax->typeID) {
  case 0:
    pEVar7 = (ExprError *)AnalyzeError(ctx,(SynError *)syntax);
    break;
  default:
    ctx->expressionDepth = uVar3;
    goto LAB_001e2f4e;
  case 4:
    pEVar7 = (ExprError *)AnalyzeVariableAccess(ctx,(SynIdentifier *)syntax);
    break;
  case 5:
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar8 = "ERROR: cannot take typeid from auto type";
    goto LAB_001e2e2e;
  case 6:
    pcVar8 = "ERROR: cannot take typeid from generic type";
    goto LAB_001e2f55;
  case 7:
    pEVar7 = (ExprError *)AnalyzeTypeSimple(ctx,(SynTypeSimple *)syntax);
    break;
  case 8:
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar8 = "ERROR: cannot take typeid from generic type";
LAB_001e2e2e:
    pEVar7 = anon_unknown.dwarf_1117a3::ReportExpected(ctx,syntax,pTVar6,pcVar8);
    break;
  case 9:
    pEVar7 = (ExprError *)AnalyzeTypeArray(ctx,(SynTypeArray *)syntax);
    break;
  case 10:
    pEVar7 = (ExprError *)AnalyzeTypeReference(ctx,(SynTypeReference *)syntax);
    break;
  case 0xb:
    pEVar7 = (ExprError *)AnalyzeTypeFunction(ctx,(SynTypeFunction *)syntax);
    break;
  case 0xc:
    pEVar7 = (ExprError *)AnalyzeTypeGenericInstance(ctx,(SynTypeGenericInstance *)syntax);
    break;
  case 0xd:
    pEVar7 = (ExprError *)AnalyzeTypeof(ctx,(SynTypeof *)syntax);
    break;
  case 0xe:
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
    pTVar6 = ctx->typeBool;
    uVar2 = syntax->field_0x3a;
    pEVar5->typeID = 3;
    pEVar5->source = syntax;
    pEVar5->type = pTVar6;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6358;
    pEVar5->field_0x29 = uVar2;
    goto LAB_001e2d9d;
  case 0xf:
    pEVar7 = (ExprError *)AnalyzeNumber(ctx,(SynNumber *)syntax);
    break;
  case 0x10:
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar6 = ctx->typeNullPtr;
    pEVar5->typeID = 9;
    pEVar5->source = syntax;
    pEVar5->type = pTVar6;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
LAB_001e2d9d:
    ctx->expressionDepth = ctx->expressionDepth - 1;
    return pEVar5;
  case 0x11:
    pEVar7 = (ExprError *)AnalyzeCharacter(ctx,(SynCharacter *)syntax);
    break;
  case 0x12:
    pEVar7 = (ExprError *)AnalyzeString(ctx,(SynString *)syntax);
    break;
  case 0x13:
    pEVar7 = (ExprError *)AnalyzeArray(ctx,(SynArray *)syntax);
    break;
  case 0x14:
    pEVar7 = (ExprError *)AnalyzeGenerator(ctx,(SynGenerator *)syntax);
    break;
  case 0x17:
    pEVar7 = (ExprError *)AnalyzeMemberAccess(ctx,(SynMemberAccess *)syntax);
    break;
  case 0x19:
    pEVar7 = (ExprError *)AnalyzeArrayIndex(ctx,(SynArrayIndex *)syntax);
    break;
  case 0x1a:
    pEVar7 = (ExprError *)AnalyzeFunctionCall(ctx,(SynFunctionCall *)syntax);
    break;
  case 0x1b:
    pEVar7 = (ExprError *)AnalyzePreModify(ctx,(SynPreModify *)syntax);
    break;
  case 0x1c:
    pEVar7 = (ExprError *)AnalyzePostModify(ctx,(SynPostModify *)syntax);
    break;
  case 0x1d:
    pEVar7 = (ExprError *)AnalyzeGetAddress(ctx,(SynGetAddress *)syntax);
    break;
  case 0x1e:
    pEVar7 = (ExprError *)AnalyzeDereference(ctx,(SynDereference *)syntax);
    break;
  case 0x1f:
    pEVar7 = (ExprError *)AnalyzeSizeof(ctx,(SynSizeof *)syntax);
    break;
  case 0x20:
    pEVar7 = (ExprError *)AnalyzeNew(ctx,(SynNew *)syntax);
    break;
  case 0x21:
    pEVar7 = (ExprError *)AnalyzeConditional(ctx,(SynConditional *)syntax);
    break;
  case 0x2f:
    pEVar7 = (ExprError *)AnalyzeUnaryOp(ctx,(SynUnaryOp *)syntax);
    break;
  case 0x30:
    pEVar7 = (ExprError *)AnalyzeBinaryOp(ctx,(SynBinaryOp *)syntax);
    break;
  case 0x31:
    pEVar7 = (ExprError *)AnalyzeAssignment(ctx,(SynAssignment *)syntax);
    break;
  case 0x32:
    pEVar7 = (ExprError *)AnalyzeModifyAssignment(ctx,(SynModifyAssignment *)syntax);
    break;
  case 0x37:
    pEVar7 = (ExprError *)
             AnalyzeFunctionDefinition
                       (ctx,(SynFunctionDefinition *)syntax,(FunctionData *)0x0,(TypeFunction *)0x0,
                        (TypeBase *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),true,true,true);
    break;
  case 0x39:
    pEVar7 = (ExprError *)AnalyzeShortFunctionDefinition(ctx,(SynShortFunctionDefinition *)syntax);
  }
  ctx->expressionDepth = ctx->expressionDepth - 1;
  if (pEVar7 != (ExprError *)0x0) {
    return &pEVar7->super_ExprBase;
  }
LAB_001e2f4e:
  pcVar8 = "ERROR: unknown expression type";
LAB_001e2f55:
  anon_unknown.dwarf_1117a3::Stop(ctx,syntax,pcVar8);
}

Assistant:

ExprBase* AnalyzeExpression(ExpressionContext &ctx, SynBase *syntax)
{
	ctx.expressionDepth++;

	if(ctx.expressionDepth > NULLC_MAX_EXPRESSION_DEPTH)
		Stop(ctx, syntax, "ERROR: reached maximum generic expression depth (%d)", NULLC_MAX_EXPRESSION_DEPTH);

	ExprBase *result = NULL;

	switch(syntax->typeID)
	{
	case SynBool::myTypeID:
		result = AnalyzeBool(ctx, (SynBool*)syntax);
		break;
	case SynCharacter::myTypeID:
		result = AnalyzeCharacter(ctx, (SynCharacter*)syntax);
		break;
	case SynString::myTypeID:
		result = AnalyzeString(ctx, (SynString*)syntax);
		break;
	case SynNullptr::myTypeID:
		result = AnalyzeNullptr(ctx, (SynNullptr*)syntax);
		break;
	case SynNumber::myTypeID:
		result = AnalyzeNumber(ctx, (SynNumber*)syntax);
		break;
	case SynArray::myTypeID:
		result = AnalyzeArray(ctx, (SynArray*)syntax);
		break;
	case SynPreModify::myTypeID:
		result = AnalyzePreModify(ctx, (SynPreModify*)syntax);
		break;
	case SynPostModify::myTypeID:
		result = AnalyzePostModify(ctx, (SynPostModify*)syntax);
		break;
	case SynUnaryOp::myTypeID:
		result = AnalyzeUnaryOp(ctx, (SynUnaryOp*)syntax);
		break;
	case SynBinaryOp::myTypeID:
		result = AnalyzeBinaryOp(ctx, (SynBinaryOp*)syntax);
		break;
	case SynGetAddress::myTypeID:
		result = AnalyzeGetAddress(ctx, (SynGetAddress*)syntax);
		break;
	case SynDereference::myTypeID:
		result = AnalyzeDereference(ctx, (SynDereference*)syntax);
		break;
	case SynTypeof::myTypeID:
		result = AnalyzeTypeof(ctx, (SynTypeof*)syntax);
		break;
	case SynIdentifier::myTypeID:
		result = AnalyzeVariableAccess(ctx, (SynIdentifier*)syntax);
		break;
	case SynTypeSimple::myTypeID:
		result = AnalyzeTypeSimple(ctx, (SynTypeSimple*)syntax);
		break;
	case SynSizeof::myTypeID:
		result = AnalyzeSizeof(ctx, (SynSizeof*)syntax);
		break;
	case SynConditional::myTypeID:
		result = AnalyzeConditional(ctx, (SynConditional*)syntax);
		break;
	case SynAssignment::myTypeID:
		result = AnalyzeAssignment(ctx, (SynAssignment*)syntax);
		break;
	case SynModifyAssignment::myTypeID:
		result = AnalyzeModifyAssignment(ctx, (SynModifyAssignment*)syntax);
		break;
	case SynMemberAccess::myTypeID:
		result = AnalyzeMemberAccess(ctx, (SynMemberAccess*)syntax);
		break;
	case SynTypeArray::myTypeID:
		result = AnalyzeTypeArray(ctx, (SynTypeArray*)syntax);
		break;
	case SynArrayIndex::myTypeID:
		result = AnalyzeArrayIndex(ctx, (SynArrayIndex*)syntax);
		break;
	case SynFunctionCall::myTypeID:
		result = AnalyzeFunctionCall(ctx, (SynFunctionCall*)syntax);
		break;
	case SynNew::myTypeID:
		result = AnalyzeNew(ctx, (SynNew*)syntax);
		break;
	case SynFunctionDefinition::myTypeID:
		result = AnalyzeFunctionDefinition(ctx, (SynFunctionDefinition*)syntax, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, true, true);
		break;
	case SynGenerator::myTypeID:
		result = AnalyzeGenerator(ctx, (SynGenerator*)syntax);
		break;
	case SynTypeReference::myTypeID:
		result = AnalyzeTypeReference(ctx, (SynTypeReference*)syntax);
		break;
	case SynTypeFunction::myTypeID:
		result = AnalyzeTypeFunction(ctx, (SynTypeFunction*)syntax);
		break;
	case SynTypeGenericInstance::myTypeID:
		result = AnalyzeTypeGenericInstance(ctx, (SynTypeGenericInstance*)syntax);
		break;
	case SynShortFunctionDefinition::myTypeID:
		result = AnalyzeShortFunctionDefinition(ctx, (SynShortFunctionDefinition*)syntax);
		break;
	case SynTypeAuto::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from auto type");
		break;
	case SynTypeAlias::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from generic type");
		break;
	case SynTypeGeneric::myTypeID:
		Stop(ctx, syntax, "ERROR: cannot take typeid from generic type");

		break;
	case SynError::myTypeID:
		result = AnalyzeError(ctx, (SynError*)syntax);
		break;
	default:
		break;
	}

	ctx.expressionDepth--;

	if(!result)
		Stop(ctx, syntax, "ERROR: unknown expression type");

	return result;
}